

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void expandChallenge(uint16_t *challengeC,uint16_t *challengeP,uint8_t *sigH,
                    picnic_instance_t *params)

{
  hash_context *ctx_00;
  long in_RCX;
  void *in_RDX;
  long in_RSI;
  uint16_t *in_RDI;
  size_t i_1;
  size_t numChunks_1;
  size_t countP;
  size_t i;
  size_t numChunks;
  size_t countC;
  uint16_t chunks [128];
  uint32_t bitsPerChunkP;
  uint32_t bitsPerChunkC;
  hash_context ctx;
  uint8_t h [64];
  uint8_t *in_stack_fffffffffffffd78;
  hash_context *data;
  hash_context *in_stack_fffffffffffffd80;
  ulong local_278;
  uint16_t *in_stack_fffffffffffffd90;
  uint16_t *in_stack_fffffffffffffd98;
  uint8_t *input;
  size_t in_stack_fffffffffffffda8;
  undefined1 local_68 [72];
  long local_20;
  void *local_18;
  long local_10;
  uint16_t *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_68,0,0x40);
  memcpy(local_68,local_18,(ulong)*(byte *)(local_20 + 6));
  ceil_log2(0x14190f);
  ceil_log2(0x141927);
  memset(&stack0xfffffffffffffda8,0,0x100);
  input = (uint8_t *)0x0;
  do {
    if ((uint8_t *)(ulong)*(byte *)(local_20 + 10) <= input) {
      local_278 = 0;
      do {
        if (*(byte *)(local_20 + 10) <= local_278) {
          return;
        }
        ctx_00 = (hash_context *)
                 bitsToChunks(in_stack_fffffffffffffda8,input,(size_t)in_stack_fffffffffffffd98,
                              in_stack_fffffffffffffd90);
        for (data = (hash_context *)0x0; data < ctx_00;
            data = (hash_context *)((data->sponge).state + 1)) {
          if (*(ushort *)(&stack0xfffffffffffffda8 + (long)data * 2) <
              (ushort)*(byte *)(local_20 + 0xb)) {
            *(undefined2 *)(local_10 + local_278 * 2) =
                 *(undefined2 *)(&stack0xfffffffffffffda8 + (long)data * 2);
            local_278 = local_278 + 1;
          }
          if (local_278 == *(byte *)(local_20 + 10)) break;
        }
        hash_init_prefix(ctx_00,(size_t)data,'\0');
        hash_update(ctx_00,(uint8_t *)data,0x141b95);
        hash_final((hash_context *)0x141ba2);
        hash_squeeze(ctx_00,(uint8_t *)data,0x141bc5);
      } while( true );
    }
    in_stack_fffffffffffffd98 =
         (uint16_t *)
         bitsToChunks(in_stack_fffffffffffffda8,input,(size_t)in_stack_fffffffffffffd98,
                      in_stack_fffffffffffffd90);
    for (in_stack_fffffffffffffd90 = (uint16_t *)0x0;
        in_stack_fffffffffffffd90 < in_stack_fffffffffffffd98;
        in_stack_fffffffffffffd90 = (uint16_t *)((long)in_stack_fffffffffffffd90 + 1)) {
      if (*(ushort *)(&stack0xfffffffffffffda8 + (long)in_stack_fffffffffffffd90 * 2) <
          *(ushort *)(local_20 + 4)) {
        input = (uint8_t *)
                appendUnique(local_8,*(uint16_t *)
                                      (&stack0xfffffffffffffda8 +
                                      (long)in_stack_fffffffffffffd90 * 2),(size_t)input);
      }
      if (input == (uint8_t *)(ulong)*(byte *)(local_20 + 10)) break;
    }
    hash_init_prefix(in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,'\0');
    hash_update(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0x141a50);
    hash_final((hash_context *)0x141a5d);
    hash_squeeze(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0x141a80);
  } while( true );
}

Assistant:

static void expandChallenge(uint16_t* challengeC, uint16_t* challengeP, const uint8_t* sigH,
                            const picnic_instance_t* params) {
  uint8_t h[MAX_DIGEST_SIZE] = {0};
  hash_context ctx;

  memcpy(h, sigH, params->digest_size);
  // Populate C
  uint32_t bitsPerChunkC = ceil_log2(params->num_rounds);
  uint32_t bitsPerChunkP = ceil_log2(params->num_MPC_parties);
  assert(bitsPerChunkC >= 4);
  assert(bitsPerChunkP >= 4);
  // chunks would only require digest_size * 8 / min(bitsPerChunkC, bitsPerChunkP), but
  // bitsPerChunkP is always 4 and the minimum.
  uint16_t chunks[MAX_DIGEST_SIZE * 8 / 4] = {0};

  size_t countC = 0;
  while (countC < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkC, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_rounds) {
        countC = appendUnique(challengeC, chunks[i], countC);
      }
      if (countC == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }

  // Note that we always compute h = H(h) after setting C
  size_t countP = 0;

  while (countP < params->num_opened_rounds) {
    size_t numChunks = bitsToChunks(bitsPerChunkP, h, params->digest_size, chunks);
    for (size_t i = 0; i < numChunks; i++) {
      if (chunks[i] < params->num_MPC_parties) {
        challengeP[countP] = chunks[i];
        countP++;
      }
      if (countP == params->num_opened_rounds) {
        break;
      }
    }

    hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_1);
    hash_update(&ctx, h, params->digest_size);
    hash_final(&ctx);
    hash_squeeze(&ctx, h, params->digest_size);
    hash_clear(&ctx);
  }
}